

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::SessionState(SessionState *this,UtcTimeStamp *now)

{
  UtcTimeStamp *now_local;
  SessionState *this_local;
  
  MessageStore::MessageStore(&this->super_MessageStore);
  Log::Log(&this->super_Log);
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__SessionState_00330a50;
  (this->super_Log)._vptr_Log = (_func_int **)&DAT_00330af0;
  this->m_enabled = true;
  this->m_receivedLogon = false;
  this->m_sentLogout = false;
  this->m_sentLogon = false;
  this->m_sentReset = false;
  this->m_receivedReset = false;
  this->m_initiate = false;
  this->m_logonTimeout = 10;
  this->m_logoutTimeout = 2;
  this->m_testRequest = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&this->m_resendRange);
  HeartBtInt::HeartBtInt(&this->m_heartBtInt);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastSentTime,now);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastReceivedTime,now);
  std::__cxx11::string::string((string *)&this->m_logoutReason);
  std::
  map<unsigned_long,_FIX::Message,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FIX::Message>_>_>
  ::map(&this->m_queue);
  this->m_pStore = (MessageStore *)0x0;
  this->m_pLog = (Log *)0x0;
  NullLog::NullLog(&this->m_nullLog);
  Mutex::Mutex(&this->m_mutex);
  return;
}

Assistant:

SessionState(const UtcTimeStamp &now)
      : m_enabled(true),
        m_receivedLogon(false),
        m_sentLogout(false),
        m_sentLogon(false),
        m_sentReset(false),
        m_receivedReset(false),
        m_initiate(false),
        m_logonTimeout(10),
        m_logoutTimeout(2),
        m_testRequest(0),
        m_lastSentTime(now),
        m_lastReceivedTime(now),
        m_pStore(0),
        m_pLog(0) {}